

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O3

void __thiscall cmCursesLongMessageForm::HandleInput(cmCursesLongMessageForm *this)

{
  uint uVar1;
  int iVar2;
  char debugMessage [128];
  char acStack_a8 [128];
  
  if ((this->super_cmCursesForm).Form == (FORM *)0x0) {
    return;
  }
  do {
    uVar1 = wgetch(_stdscr);
    sprintf(acStack_a8,"Message widget handling input, key: %d",(ulong)uVar1);
    cmCursesForm::LogMessage(acStack_a8);
    iVar2 = 0x22a;
    if ((int)uVar1 < 0x6f) {
      if ((int)uVar1 < 0x10) {
        if (uVar1 == 4) {
LAB_0021fa33:
          iVar2 = 0x22c;
        }
        else if (uVar1 != 0xe) goto LAB_0021fa41;
      }
      else if (uVar1 == 0x10) {
LAB_0021fa09:
        iVar2 = 0x22b;
      }
      else {
        if (uVar1 != 0x15) {
          if (uVar1 == 0x65) {
            return;
          }
          goto LAB_0021fa41;
        }
LAB_0021fa2c:
        iVar2 = 0x22d;
      }
LAB_0021fa38:
      form_driver((FORM_conflict *)(this->super_cmCursesForm).Form,iVar2);
    }
    else if ((int)uVar1 < 0x152) {
      if (uVar1 == 0x102) goto LAB_0021fa38;
      if (uVar1 == 0x103) goto LAB_0021fa09;
      if (uVar1 == 0x6f) {
        return;
      }
    }
    else {
      if (uVar1 == 0x152) goto LAB_0021fa33;
      if (uVar1 == 0x153) goto LAB_0021fa2c;
    }
LAB_0021fa41:
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
    PrintKeys(this);
    if (_stdscr == 0) {
      iVar2 = -1;
    }
    else {
      iVar2 = *(short *)(_stdscr + 4) + 1;
    }
    wtouchln(_stdscr,0,iVar2,1);
    wrefresh(_stdscr);
  } while( true );
}

Assistant:

void cmCursesLongMessageForm::HandleInput()
{
  if (!this->Form)
    {
    return;
    }

  char debugMessage[128];

  for(;;)
    {
    int key = getch();

    sprintf(debugMessage, "Message widget handling input, key: %d", key);
    cmCursesForm::LogMessage(debugMessage);

    // quit
    if ( key == 'o' || key == 'e' )
      {
      break;
      }
    else if ( key == KEY_DOWN || key == ctrl('n') )
      {
      form_driver(this->Form, REQ_SCR_FLINE);
      }
    else if ( key == KEY_UP  || key == ctrl('p') )
      {
      form_driver(this->Form, REQ_SCR_BLINE);
      }
    else if ( key == KEY_NPAGE || key == ctrl('d') )
      {
      form_driver(this->Form, REQ_SCR_FPAGE);
      }
    else if ( key == KEY_PPAGE || key == ctrl('u') )
      {
      form_driver(this->Form, REQ_SCR_BPAGE);
      }

    this->UpdateStatusBar();
    this->PrintKeys();
    touchwin(stdscr);
    wrefresh(stdscr);
    }

}